

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EratMedium.cpp
# Opt level: O2

void __thiscall
primesieve::EratMedium::crossOff_31(EratMedium *this,uint8_t *sieve,size_t sieveSize,Bucket *bucket)

{
  SievingPrime **ppSVar1;
  SievingPrime *pSVar2;
  uintptr_t address;
  ulong uVar3;
  ulong uVar4;
  
  ppSVar1 = (this->buckets_).array_;
  pSVar2 = bucket->end_;
  uVar4 = (ulong)((bucket->sievingPrimes_[0].indexes_ >> 0x17) - 0x38);
  if (bucket->sievingPrimes_ != pSVar2) {
    uVar3 = (ulong)bucket->sievingPrimes_[0].sievingPrime_;
    (*(code *)(&DAT_0014bb04 + *(int *)(&DAT_0014bb04 + uVar4 * 4)))
              (uVar3 * 2,uVar3 * 4,uVar3 * 6 + 1,uVar3 * 6,
               &DAT_0014bb04 + *(int *)(&DAT_0014bb04 + uVar4 * 4),pSVar2,ppSVar1 + 0x3e,
               ppSVar1 + 0x3d,ppSVar1 + 0x3c,ppSVar1 + 0x3b,ppSVar1 + 0x3a,ppSVar1 + 0x39,
               ppSVar1 + 0x38,ppSVar1 + 0x3f,uVar4,pSVar2,this->memoryPool_);
    return;
  }
  return;
}

Assistant:

void EratMedium::crossOff_31(uint8_t* sieve, std::size_t sieveSize, Bucket* bucket)
{
  auto buckets = buckets_.data();
  MemoryPool& memoryPool = *memoryPool_;
  SievingPrime* prime = bucket->begin();
  SievingPrime* end = bucket->end();
  std::size_t wheelIndex = prime->getWheelIndex();

  for (; prime != end; prime++)
  {
    std::size_t sievingPrime = prime->getSievingPrime();
    std::size_t i = prime->getMultipleIndex();
    std::size_t dist0 = sievingPrime * 6 + 1;
    std::size_t dist1 = sievingPrime * 4 + 0;
    std::size_t dist2 = sievingPrime * 2 + 0;
    std::size_t dist6 = sievingPrime * 6 + 0;

    ASSERT(wheelIndex >= 56);
    ASSERT(wheelIndex <= 63);

    switch (wheelIndex)
    {
      default: UNREACHABLE;

      for (;;)
      {
        case 56: CHECK_FINISHED(56); sieve[i] &= BIT7; i += dist0; FALLTHROUGH;
        case 57: CHECK_FINISHED(57); sieve[i] &= BIT0; i += dist1; FALLTHROUGH;
        case 58: CHECK_FINISHED(58); sieve[i] &= BIT1; i += dist2; FALLTHROUGH;
        case 59: CHECK_FINISHED(59); sieve[i] &= BIT2; i += dist1; FALLTHROUGH;
        case 60: CHECK_FINISHED(60); sieve[i] &= BIT3; i += dist2; FALLTHROUGH;
        case 61: CHECK_FINISHED(61); sieve[i] &= BIT4; i += dist1; FALLTHROUGH;
        case 62: CHECK_FINISHED(62); sieve[i] &= BIT5; i += dist6; FALLTHROUGH;
        case 63: CHECK_FINISHED(63); sieve[i] &= BIT6; i += dist2;
      }
    }
  }
}